

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_stream_file.c
# Opt level: O2

log_policy_interface log_policy_stream_file_interface(void)

{
  return &log_policy_stream_file_interface::policy_interface_stream;
}

Assistant:

log_policy_interface log_policy_stream_file_interface(void)
{
	static struct log_policy_stream_impl_type log_policy_stream_file_impl_obj = {
		&log_policy_stream_file_write,
		&log_policy_stream_file_flush
	};

	static struct log_policy_interface_type policy_interface_stream = {
		&log_policy_stream_file_create,
		&log_policy_stream_file_impl_obj,
		&log_policy_stream_file_destroy
	};

	return &policy_interface_stream;
}